

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::TraverseSchema::processBaseTypeInfo
          (TraverseSchema *this,DOMElement *elem,XMLCh *baseName,XMLCh *localPart,XMLCh *uriStr,
          ComplexTypeInfo *typeInfo)

{
  XMLBuffer *this_00;
  SchemaInfo **enclosingSchema;
  uint saveScope;
  SchemaInfo *toRestore;
  ValueVectorOf<unsigned_int> *pVVar1;
  RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher> *this_01;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ComplexTypeInfo *pCVar5;
  DatatypeValidator *pDVar6;
  DOMElement *pDVar7;
  undefined4 extraout_var;
  SchemaInfo *pSVar8;
  undefined4 *puVar9;
  XMLCh *pXVar10;
  ListType local_6c;
  uint local_38;
  uint local_34;
  
  enclosingSchema = &this->fSchemaInfo;
  toRestore = this->fSchemaInfo;
  saveScope = this->fCurrentScope;
  bVar2 = XMLString::equals(uriStr,this->fTargetNSURIString);
  if (bVar2) {
    this_00 = &this->fBuffer;
    XMLBuffer::set(this_00,uriStr);
    XMLBuffer::append(this_00,L',');
    XMLBuffer::append(this_00,localPart);
    pXVar10 = (this->fBuffer).fBuffer;
    pXVar10[(this->fBuffer).fIndex] = L'\0';
    pCVar5 = RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher>::get
                       (this->fComplexTypeRegistry,pXVar10);
    if (pCVar5 != (ComplexTypeInfo *)0x0) {
      pVVar1 = this->fCurrentTypeNameStack;
      local_34 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[5])
                           (this->fStringPool,pXVar10);
      bVar2 = ValueVectorOf<unsigned_int>::containsElement
                        (pVVar1,&local_34,this->fCircularCheckIndex);
      if (!bVar2) {
        pVVar1 = this->fCurrentTypeNameStack;
        local_38 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[5])
                             (this->fStringPool,pXVar10);
        bVar2 = ValueVectorOf<unsigned_int>::containsElement(pVVar1,&local_38,0);
        if (bVar2) {
          typeInfo->fBaseComplexTypeInfo = pCVar5;
          puVar9 = (undefined4 *)__cxa_allocate_exception(4);
          *puVar9 = 2;
          goto LAB_0031ca53;
        }
        local_6c = INCLUDE;
        if (pCVar5->fPreprocessed != true) goto LAB_0031c827;
        goto LAB_0031c83b;
      }
      iVar4 = 0x56;
      uriStr = pXVar10;
      goto LAB_0031ca3d;
    }
    local_6c = INCLUDE;
LAB_0031c83b:
    pDVar6 = getDatatypeValidator(this,uriStr,localPart);
    if (pDVar6 != (DatatypeValidator *)0x0) {
      pCVar5 = (ComplexTypeInfo *)0x0;
LAB_0031c92b:
      if (toRestore != *enclosingSchema) {
        restoreSchemaInfo(this,toRestore,local_6c,saveScope);
      }
      typeInfo->fBaseComplexTypeInfo = pCVar5;
      typeInfo->fBaseDatatypeValidator = pDVar6;
      return;
    }
    pDVar7 = SchemaInfo::getTopLevelComponent
                       (*enclosingSchema,0,(XMLCh *)SchemaSymbols::fgELT_COMPLEXTYPE,localPart,
                        enclosingSchema);
    if (pDVar7 != (DOMElement *)0x0) {
      pDVar6 = (DatatypeValidator *)0x0;
      uVar3 = traverseComplexTypeDecl(this,pDVar7,true,(XMLCh *)0x0);
      this_01 = this->fComplexTypeRegistry;
      iVar4 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[10])
                        (this->fStringPool,(ulong)uVar3);
      pCVar5 = RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher>::get
                         (this_01,(void *)CONCAT44(extraout_var,iVar4));
      goto LAB_0031c92b;
    }
    pDVar7 = SchemaInfo::getTopLevelComponent
                       (*enclosingSchema,1,(XMLCh *)SchemaSymbols::fgELT_SIMPLETYPE,localPart,
                        enclosingSchema);
    if (pDVar7 == (DOMElement *)0x0) {
      if (toRestore != *enclosingSchema) {
        restoreSchemaInfo(this,toRestore,local_6c,saveScope);
      }
      goto LAB_0031ca1f;
    }
    pCVar5 = (ComplexTypeInfo *)0x0;
    pDVar6 = traverseSimpleTypeDecl(this,pDVar7,true,0);
    if (pDVar6 != (DatatypeValidator *)0x0) goto LAB_0031c92b;
    if (toRestore != *enclosingSchema) {
      restoreSchemaInfo(this,toRestore,local_6c,saveScope);
    }
    iVar4 = 0x28;
    pXVar10 = uriStr;
  }
  else {
    bVar2 = XMLString::equals(uriStr,(XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (bVar2) {
      pDVar6 = getDatatypeValidator(this,uriStr,localPart);
      if (pDVar6 != (DatatypeValidator *)0x0) {
        pCVar5 = (ComplexTypeInfo *)0x0;
LAB_0031c82a:
        local_6c = INCLUDE;
        goto LAB_0031c92b;
      }
    }
    else {
      iVar4 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                        (this->fURIStringPool,uriStr);
      bVar2 = isImportingNS(this,iVar4);
      if (!bVar2) {
        iVar4 = 0x8e;
        goto LAB_0031ca3d;
      }
      pCVar5 = getTypeInfoFromNS(this,elem,uriStr,localPart);
      if (pCVar5 != (ComplexTypeInfo *)0x0) {
LAB_0031c827:
        pDVar6 = (DatatypeValidator *)0x0;
        goto LAB_0031c82a;
      }
      pDVar6 = getDatatypeValidator(this,uriStr,localPart);
      if (pDVar6 != (DatatypeValidator *)0x0) {
        pCVar5 = (ComplexTypeInfo *)0x0;
        local_6c = INCLUDE;
        goto LAB_0031c92b;
      }
      pSVar8 = this->fSchemaInfo;
      uVar3 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                        (this->fURIStringPool,uriStr);
      pSVar8 = SchemaInfo::getImportInfo(pSVar8,uVar3);
      if ((pSVar8 != (SchemaInfo *)0x0) && (pSVar8->fProcessed != true)) {
        local_6c = IMPORT;
        restoreSchemaInfo(this,pSVar8,IMPORT,0xfffffffe);
        goto LAB_0031c83b;
      }
    }
LAB_0031ca1f:
    iVar4 = 0x2b;
    uriStr = baseName;
LAB_0031ca3d:
    pXVar10 = (XMLCh *)0x0;
    localPart = (XMLCh *)0x0;
  }
  reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,iVar4,uriStr,localPart,pXVar10,
                    (XMLCh *)0x0);
  puVar9 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar9 = 1;
LAB_0031ca53:
  __cxa_throw(puVar9,&ExceptionCodes::typeinfo,0);
}

Assistant:

void TraverseSchema::processBaseTypeInfo(const DOMElement* const elem,
                                         const XMLCh* const baseName,
                                         const XMLCh* const localPart,
                                         const XMLCh* const uriStr,
                                         ComplexTypeInfo* const typeInfo) {

    SchemaInfo*          saveInfo = fSchemaInfo;
    ComplexTypeInfo*     baseComplexTypeInfo = 0;
    DatatypeValidator*   baseDTValidator = 0;
    SchemaInfo::ListType infoType = SchemaInfo::INCLUDE;
    unsigned int         saveScope = fCurrentScope;

    // check if the base type is from another schema
    if (!XMLString::equals(uriStr, fTargetNSURIString)) {

        // check for datatype validator if it's schema for schema URI
        if (XMLString::equals(uriStr, SchemaSymbols::fgURI_SCHEMAFORSCHEMA)) {

            baseDTValidator = getDatatypeValidator(uriStr, localPart);

            if (!baseDTValidator) {
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BaseTypeNotFound, baseName);
                throw TraverseSchema::InvalidComplexTypeInfo;
            }
        }
        else {

            // Make sure that we have an explicit import statement.
            // Clause 4 of Schema Representation Constraint:
            // http://www.w3.org/TR/xmlschema-1/#src-resolve
            unsigned int uriId = fURIStringPool->addOrFind(uriStr);

            if (!isImportingNS(uriId)) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidNSReference, uriStr);
                throw TraverseSchema::InvalidComplexTypeInfo;
            }

            baseComplexTypeInfo = getTypeInfoFromNS(elem, uriStr, localPart);

            if (!baseComplexTypeInfo) {

              baseDTValidator = getDatatypeValidator(uriStr, localPart);

              if (!baseDTValidator)
              {
                SchemaInfo* impInfo = fSchemaInfo->getImportInfo(fURIStringPool->addOrFind(uriStr));

                if (!impInfo || impInfo->getProcessed())
                {
                    reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BaseTypeNotFound, baseName);
                    throw TraverseSchema::InvalidComplexTypeInfo;
                }

                infoType = SchemaInfo::IMPORT;
                restoreSchemaInfo(impInfo, infoType);
              }
            }
        }
    }
    else {

        fBuffer.set(uriStr);
        fBuffer.append(chComma);
        fBuffer.append(localPart);

        // assume the base is a complexType and try to locate the base type first
        const XMLCh* fullBaseName = fBuffer.getRawBuffer();
        baseComplexTypeInfo = fComplexTypeRegistry->get(fullBaseName);

        // Circular check
        if (baseComplexTypeInfo) {

            if (fCurrentTypeNameStack->containsElement(fStringPool->addOrFind(fullBaseName), fCircularCheckIndex)) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::NoCircularDefinition, fullBaseName);
                throw TraverseSchema::InvalidComplexTypeInfo;
            }
            else if (fCurrentTypeNameStack->containsElement(fStringPool->addOrFind(fullBaseName))) {

                typeInfo->setBaseComplexTypeInfo(baseComplexTypeInfo);
                throw TraverseSchema::RecursingElement;
            }
            else if (baseComplexTypeInfo->getPreprocessed()) {
                baseComplexTypeInfo = 0;
            }
        }
    }

    // if not found, 2 possibilities:
    //           1: ComplexType in question has not been compiled yet;
    //           2: base is SimpleType;
    if (!baseComplexTypeInfo && !baseDTValidator) {

        baseDTValidator = getDatatypeValidator(uriStr, localPart);

        if (baseDTValidator == 0) {

            DOMElement* baseTypeNode = fSchemaInfo->getTopLevelComponent(SchemaInfo::C_ComplexType,
                SchemaSymbols::fgELT_COMPLEXTYPE, localPart, &fSchemaInfo);

            if (baseTypeNode != 0) {

                int baseTypeSymbol = traverseComplexTypeDecl(baseTypeNode);
                baseComplexTypeInfo = fComplexTypeRegistry->get(fStringPool->getValueForId(baseTypeSymbol));
            }
            else {

                baseTypeNode = fSchemaInfo->getTopLevelComponent(SchemaInfo::C_SimpleType,
                    SchemaSymbols::fgELT_SIMPLETYPE, localPart, &fSchemaInfo);

                if (baseTypeNode != 0) {

                    baseDTValidator = traverseSimpleTypeDecl(baseTypeNode);

                    if (baseDTValidator == 0)  {

                        // restore schema information, if necessary
                        if (saveInfo != fSchemaInfo) {
                            restoreSchemaInfo(saveInfo, infoType, saveScope);
                        }

                        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TypeNotFound, uriStr, localPart, uriStr);
                        throw TraverseSchema::InvalidComplexTypeInfo;
                    }
                }
                else {

                    // restore schema information, if necessary
                    if (saveInfo != fSchemaInfo) {
                        restoreSchemaInfo(saveInfo, infoType, saveScope);
                    }
                    reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BaseTypeNotFound, baseName);
                    throw TraverseSchema::InvalidComplexTypeInfo;
                }
            }
        }
    } // end if

    // restore schema information, if necessary
    if (saveInfo != fSchemaInfo) {
        restoreSchemaInfo(saveInfo, infoType, saveScope);
    }

    typeInfo->setBaseComplexTypeInfo(baseComplexTypeInfo);
    typeInfo->setBaseDatatypeValidator(baseDTValidator);
}